

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

void __thiscall QGenericUnixThemePrivate::QGenericUnixThemePrivate(QGenericUnixThemePrivate *this)

{
  long lVar1;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar2;
  QDebug *pQVar3;
  QFont *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff28;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  char *in_stack_ffffffffffffff38;
  char **s;
  QFont *this_01;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  QString *in_stack_ffffffffffffff58;
  QFont *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  QDebug local_90;
  QDebug in_stack_ffffffffffffff78;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70 [10];
  QFont *in_stack_ffffffffffffffe0;
  QDebug *stream;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QPlatformThemePrivate::QPlatformThemePrivate((QPlatformThemePrivate *)0xae3750);
  (in_RDI->d).d.ptr = (QFontPrivate *)&PTR__QGenericUnixThemePrivate_00e25448;
  this_00 = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)&in_RDI[2].resolve_mask;
  QLatin1String::QLatin1String((QLatin1String *)in_RDI,in_stack_ffffffffffffff38);
  latin1.m_data = in_stack_ffffffffffffff68;
  latin1.m_size = (qsizetype)in_stack_ffffffffffffff60;
  QString::QString((QString *)in_RDI,latin1);
  QFont::QFont(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
               in_stack_ffffffffffffff50,SUB81((ulong)this_01 >> 0x38,0));
  QString::~QString((QString *)0xae37c9);
  s = (char **)&in_RDI[3].resolve_mask;
  QLatin1String::QLatin1String((QLatin1String *)in_RDI,(char *)s);
  latin1_00.m_data = in_stack_ffffffffffffff68;
  latin1_00.m_size = (qsizetype)in_stack_ffffffffffffff60;
  QString::QString((QString *)in_RDI,latin1_00);
  QFont::pointSize((QFont *)0xae380d);
  QFont::QFont(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
               in_stack_ffffffffffffff50,SUB81((ulong)this_01 >> 0x38,0));
  QString::~QString((QString *)0xae3836);
  QFont::setStyleHint(in_RDI,(StyleHint)((ulong)s >> 0x20),(StyleStrategy)s);
  stream = (QDebug *)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivateLogging::lcQpaFonts();
  anon_unknown.dwarf_1dcbdf5::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (this_00,in_stack_ffffffffffffff28);
  while( true ) {
    bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffe8);
    if (!bVar2) break;
    anon_unknown.dwarf_1dcbdf5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae38a4);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)s,(int)((ulong)this_00 >> 0x20),
               (char *)in_stack_ffffffffffffff28,(char *)0xae38ba);
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<((QDebug *)this_01,(char *)in_stack_ffffffffffffff78.stream);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffff78,pQVar3);
    ::operator<<(stream,in_stack_ffffffffffffffe0);
    pQVar3 = QDebug::operator<<((QDebug *)this_01,(char *)in_stack_ffffffffffffff78.stream);
    QDebug::QDebug(&local_78,pQVar3);
    ::operator<<(stream,in_stack_ffffffffffffffe0);
    QDebug::~QDebug(local_70);
    QDebug::~QDebug(&local_78);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffff78);
    QDebug::~QDebug(&local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGenericUnixThemePrivate::QGenericUnixThemePrivate()
    : QPlatformThemePrivate()
    , systemFont(QLatin1StringView(QGenericUnixTheme::defaultSystemFontNameC),
                 QGenericUnixTheme::defaultSystemFontSize)
    , fixedFont(QLatin1StringView(QGenericUnixTheme::defaultFixedFontNameC),
                systemFont.pointSize())
{
    fixedFont.setStyleHint(QFont::TypeWriter);
    qCDebug(lcQpaFonts) << "default fonts: system" << systemFont << "fixed" << fixedFont;
}